

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O3

unsafe_optional_ptr<Node>
duckdb::GetChildInternal<duckdb::Node_const>(ART *art,Node *node,uint8_t byte)

{
  _Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> _Var1;
  idx_t iVar2;
  NType NVar3;
  type paVar4;
  iterator iVar5;
  pointer pFVar6;
  data_ptr_t pdVar7;
  InternalException *this;
  Node *pNVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  bool bVar12;
  string local_68;
  string local_48;
  
  uVar9 = (node->super_IndexPointer).data;
  NVar3 = (NType)(uVar9 >> 0x38);
  uVar10 = (uint)(uVar9 >> 0x20);
  switch(NVar3 & 0x7f) {
  case NODE_4:
    paVar4 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
             ::operator*(&art->allocators);
    _Var1._M_head_impl =
         paVar4->_M_elems[2].
         super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
         .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
    local_68._M_dataplus._M_p = (pointer)(uVar9 & 0xffffffff);
    iVar5 = ::std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&((_Var1._M_head_impl)->buffers)._M_h,(key_type *)&local_68);
    pFVar6 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
             ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                           *)((long)iVar5.
                                    super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false>
                                    ._M_cur + 0x10));
    pdVar7 = FixedSizeBuffer::Get(pFVar6,true);
    lVar11 = (ulong)(uVar10 & 0xffffff) * (_Var1._M_head_impl)->segment_size;
    iVar2 = (_Var1._M_head_impl)->bitmask_offset;
    if ((ulong)pdVar7[iVar2 + lVar11] != 0) {
      pNVar8 = (Node *)(pdVar7 + lVar11 + iVar2);
      uVar9 = 0;
      do {
        pNVar8 = pNVar8 + 1;
        if (pdVar7[uVar9 + iVar2 + lVar11 + 1] == byte) {
          return (unsafe_optional_ptr<Node>)pNVar8;
        }
        uVar9 = uVar9 + 1;
      } while (pdVar7[iVar2 + lVar11] != uVar9);
    }
    break;
  case NODE_16:
    paVar4 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
             ::operator*(&art->allocators);
    _Var1._M_head_impl =
         paVar4->_M_elems[3].
         super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
         .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
    local_68._M_dataplus._M_p = (pointer)(uVar9 & 0xffffffff);
    iVar5 = ::std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&((_Var1._M_head_impl)->buffers)._M_h,(key_type *)&local_68);
    pFVar6 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
             ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                           *)((long)iVar5.
                                    super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false>
                                    ._M_cur + 0x10));
    pdVar7 = FixedSizeBuffer::Get(pFVar6,true);
    lVar11 = (ulong)(uVar10 & 0xffffff) * (_Var1._M_head_impl)->segment_size;
    iVar2 = (_Var1._M_head_impl)->bitmask_offset;
    if ((ulong)pdVar7[iVar2 + lVar11] != 0) {
      pNVar8 = (Node *)(pdVar7 + lVar11 + iVar2 + 0x18);
      uVar9 = 0;
      do {
        if (pdVar7[uVar9 + iVar2 + lVar11 + 1] == byte) {
          return (unsafe_optional_ptr<Node>)pNVar8;
        }
        uVar9 = uVar9 + 1;
        pNVar8 = pNVar8 + 1;
      } while (pdVar7[iVar2 + lVar11] != uVar9);
    }
    break;
  case NODE_48:
    paVar4 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
             ::operator*(&art->allocators);
    _Var1._M_head_impl =
         paVar4->_M_elems[4].
         super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
         .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
    local_68._M_dataplus._M_p = (pointer)(uVar9 & 0xffffffff);
    iVar5 = ::std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&((_Var1._M_head_impl)->buffers)._M_h,(key_type *)&local_68);
    pFVar6 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
             ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                           *)((long)iVar5.
                                    super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false>
                                    ._M_cur + 0x10));
    pdVar7 = FixedSizeBuffer::Get(pFVar6,true);
    lVar11 = (_Var1._M_head_impl)->bitmask_offset +
             (ulong)(uVar10 & 0xffffff) * (_Var1._M_head_impl)->segment_size;
    bVar12 = pdVar7[(ulong)byte + 1 + lVar11] == 0x30;
    pNVar8 = (Node *)(pdVar7 + (ulong)pdVar7[(ulong)byte + 1 + lVar11] * 8 + lVar11 + 0x108);
    goto LAB_015ac853;
  case NODE_256:
    paVar4 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
             ::operator*(&art->allocators);
    _Var1._M_head_impl =
         paVar4->_M_elems[5].
         super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
         .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
    local_68._M_dataplus._M_p = (pointer)(uVar9 & 0xffffffff);
    iVar5 = ::std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&((_Var1._M_head_impl)->buffers)._M_h,(key_type *)&local_68);
    pFVar6 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
             ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                           *)((long)iVar5.
                                    super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false>
                                    ._M_cur + 0x10));
    pdVar7 = FixedSizeBuffer::Get(pFVar6,true);
    lVar11 = (ulong)byte * 8 +
             (_Var1._M_head_impl)->bitmask_offset +
             (ulong)(uVar10 & 0xffffff) * (_Var1._M_head_impl)->segment_size;
    pNVar8 = (Node *)(pdVar7 + lVar11 + 8);
    bVar12 = pdVar7[lVar11 + 0xf] == '\0';
LAB_015ac853:
    if (bVar12) {
      return (unsafe_optional_ptr<Node>)(Node *)0x0;
    }
    return (unsafe_optional_ptr<Node>)pNVar8;
  default:
    this = (InternalException *)__cxa_allocate_exception(0x10);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"Invalid node type for GetChildInternal: %s.","");
    EnumUtil::ToString<duckdb::NType>(&local_48,NVar3 & 0x7f);
    InternalException::InternalException<std::__cxx11::string>(this,&local_68,&local_48);
    __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  return (unsafe_optional_ptr<Node>)(Node *)0x0;
}

Assistant:

void Node::Free(ART &art, Node &node) {
	if (!node.HasMetadata()) {
		return node.Clear();
	}

	// Free the children.
	auto type = node.GetType();
	switch (type) {
	case NType::PREFIX:
		return Prefix::Free(art, node);
	case NType::LEAF:
		return Leaf::DeprecatedFree(art, node);
	case NType::NODE_4:
		Node4::Free(art, node);
		break;
	case NType::NODE_16:
		Node16::Free(art, node);
		break;
	case NType::NODE_48:
		Node48::Free(art, node);
		break;
	case NType::NODE_256:
		Node256::Free(art, node);
		break;
	case NType::LEAF_INLINED:
		return node.Clear();
	case NType::NODE_7_LEAF:
	case NType::NODE_15_LEAF:
	case NType::NODE_256_LEAF:
		break;
	}

	GetAllocator(art, type).Free(node);
	node.Clear();
}